

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O2

int __thiscall
ws::Crypto::verify_sign
          (Crypto *this,string *msg_sign,string *time_stamp,string *nonce,string *msg_encrypt)

{
  __type_conflict1 _Var1;
  string *psVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  string local_f0;
  string dev_msg_sign;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  psVar2 = nonce;
  std::__cxx11::string::string(local_b0,&this->token);
  std::__cxx11::string::string(local_90,time_stamp);
  std::__cxx11::string::string(local_70,nonce);
  std::__cxx11::string::string(local_50,msg_encrypt);
  args._M_len = (size_type)psVar2;
  args._M_array = (iterator)0x4;
  wx_sort(&local_f0,(ws *)local_b0,args);
  wx_sha1(&dev_msg_sign,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  lVar3 = 0x60;
  do {
    std::__cxx11::string::~string(local_b0 + lVar3);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  _Var1 = std::operator==(&dev_msg_sign,msg_sign);
  std::__cxx11::string::~string((string *)&dev_msg_sign);
  return _Var1 - 1;
}

Assistant:

int verify_sign(const std::string &msg_sign, const std::string &time_stamp,
                    const std::string &nonce, const std::string &msg_encrypt)
    {
      std::string dev_msg_sign = wx_sha1(wx_sort({token, time_stamp, nonce, msg_encrypt}));
      if (dev_msg_sign == msg_sign)
      {
        return 0;
      }
      else
        return -1;
    }